

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O2

void borg_init_flow_kill(void)

{
  monster_race *pmVar1;
  char **ppcVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  uint *puVar6;
  angband_constants *paVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  long lVar13;
  ulong uVar14;
  int16_t what [1024];
  undefined8 local_2038 [1025];
  
  borg_kills_cnt = 0;
  borg_kills_nxt = 1;
  borg_kills = (borg_kill *)mem_zalloc(0x1d800);
  borg_race_count = (int16_t *)mem_zalloc((ulong)((uint)z_info->r_max * 2));
  borg_race_death = (int16_t *)mem_zalloc((ulong)((uint)z_info->r_max * 2));
  lVar13 = 0x160;
  paVar7 = z_info;
  for (lVar10 = 1; pmVar1 = r_info, lVar10 < (long)((ulong)paVar7->r_max - 1); lVar10 = lVar10 + 1)
  {
    if (((*(long *)((long)r_info + lVar13 + -0x80) != 0) &&
        (_Var3 = flag_has_dbg((bitflag *)((long)r_info + lVar13 + -0x34),0xb,1,"r_ptr->flags",
                              "RF_UNIQUE"), paVar7 = z_info, !_Var3)) &&
       (pmVar1->flags[lVar13 + -0x5c] == '\0')) {
      borg_race_death[lVar10] = 1;
    }
    lVar13 = lVar13 + 0xd0;
  }
  uVar9 = (ulong)(paVar7->r_max - 1 & 0xffff);
  wVar11 = L'\0';
  lVar10 = 300;
  for (uVar14 = 1; pmVar1 = r_info, lVar13 = (long)wVar11, uVar14 < uVar9; uVar14 = uVar14 + 1) {
    if ((*(long *)((long)r_info + lVar10 + -0x4c) != 0) &&
       (_Var3 = flag_has_dbg(r_info->flags + lVar10 + -0x5c,0xb,1,"r_ptr->flags","RF_UNIQUE"), _Var3
       )) {
      pcVar5 = borg_massage_special_chars(*(char **)((long)pmVar1 + lVar10 + -0x4c));
      local_2038[lVar13] = pcVar5;
      what[lVar13] = (int16_t)uVar14;
      pcVar5 = *(char **)((long)pmVar1 + lVar10 + -0x4c);
      iVar4 = strcmp(pcVar5,"Morgoth, Lord of Darkness");
      if (iVar4 == 0) {
        borg_morgoth_id = *(uint *)((long)pmVar1 + lVar10 + -0x54);
      }
      iVar4 = strcmp(pcVar5,"Sauron, the Sorcerer");
      if (iVar4 == 0) {
        borg_sauron_id = *(uint *)((long)pmVar1 + lVar10 + -0x54);
      }
      iVar4 = strcmp(pcVar5,"The Tarrasque");
      if (iVar4 == 0) {
        borg_tarrasque_id = *(uint *)((long)pmVar1 + lVar10 + -0x54);
      }
      wVar11 = wVar11 + L'\x01';
    }
    lVar10 = lVar10 + 0xd0;
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(local_2038,what,wVar11);
  borg_unique_size = wVar11;
  borg_unique_text = (char **)mem_zalloc(lVar13 << 3);
  puVar6 = (uint *)mem_zalloc((long)borg_unique_size << 2);
  ppcVar2 = borg_unique_text;
  uVar8 = 0;
  uVar14 = (ulong)(uint)wVar11;
  borg_unique_what = puVar6;
  if (wVar11 < L'\x01') {
    uVar14 = uVar8;
  }
  for (; uVar14 != uVar8; uVar8 = uVar8 + 1) {
    ppcVar2[uVar8] = (char *)local_2038[uVar8];
  }
  for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
    puVar6[uVar8] = (int)what[uVar8];
  }
  wVar11 = L'\0';
  lVar10 = 300;
  for (uVar14 = 1; pmVar1 = r_info, lVar13 = (long)wVar11, uVar14 < uVar9; uVar14 = uVar14 + 1) {
    wVar12 = wVar11;
    if ((*(long *)((long)r_info + lVar10 + -0x4c) != 0) &&
       (_Var3 = flag_has_dbg(r_info->flags + lVar10 + -0x5c,0xb,1,"r_ptr->flags","RF_UNIQUE"),
       !_Var3)) {
      pcVar5 = borg_massage_special_chars(*(char **)((long)pmVar1 + lVar10 + -0x4c));
      local_2038[lVar13] = pcVar5;
      what[lVar13] = (int16_t)uVar14;
      wVar12 = wVar11 + L'\x01';
      pcVar5 = *(char **)((long)pmVar1 + lVar10 + -0x3c);
      if (pcVar5 != (char *)0x0) {
        pcVar5 = borg_massage_special_chars(pcVar5);
        local_2038[wVar12] = pcVar5;
        what[wVar12] = (int16_t)uVar14;
        wVar12 = wVar11 + L'\x02';
      }
    }
    wVar11 = wVar12;
    lVar10 = lVar10 + 0xd0;
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(local_2038,what,wVar11);
  borg_normal_size = wVar11;
  borg_normal_text = (char **)mem_zalloc(lVar13 << 3);
  puVar6 = (uint *)mem_zalloc((long)borg_normal_size << 2);
  ppcVar2 = borg_normal_text;
  uVar9 = 0;
  uVar14 = (ulong)(uint)wVar11;
  borg_normal_what = puVar6;
  if (wVar11 < L'\x01') {
    uVar14 = uVar9;
  }
  for (; uVar14 != uVar9; uVar9 = uVar9 + 1) {
    ppcVar2[uVar9] = (char *)local_2038[uVar9];
  }
  for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
    puVar6[uVar9] = (int)what[uVar9];
  }
  return;
}

Assistant:

void borg_init_flow_kill(void)
{
    /*** Monster tracking ***/

    /* No monsters yet */
    borg_kills_cnt = 0;
    borg_kills_nxt = 1;

    /* Array of monsters */
    borg_kills = mem_zalloc(256 * sizeof(borg_kill));

    /* Count racial appearances */
    borg_race_count = mem_zalloc(z_info->r_max * sizeof(int16_t));

    /* Count racial deaths */
    borg_race_death = mem_zalloc(z_info->r_max * sizeof(int16_t));

    /*** XXX XXX XXX Hack -- Cheat ***/

    /* Hack -- Extract dead uniques */
    for (int i = 1; i < z_info->r_max - 1; i++) {
        struct monster_race *r_ptr = &r_info[i];

        /* Skip non-monsters */
        if (!r_ptr->name)
            continue;

        /* Skip non-uniques */
        if (rf_has(r_ptr->flags, RF_UNIQUE))
            continue;

        /* Mega-Hack -- Access "dead unique" list */
        if (r_ptr->max_num == 0)
            borg_race_death[i] = 1;
    }

    borg_init_monster_names();
}